

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertEqualString(char *expected,char *actual,char *msg,UNITY_UINT lineNumber)

{
  bool bVar1;
  uint local_2c;
  UNITY_UINT32 i;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  char *actual_local;
  char *expected_local;
  
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    if ((expected == (char *)0x0) || (actual == (char *)0x0)) {
      if (expected != actual) {
        Unity.CurrentTestFailed = 1;
      }
    }
    else {
      local_2c = 0;
      while( true ) {
        bVar1 = true;
        if (expected[local_2c] == '\0') {
          bVar1 = actual[local_2c] != '\0';
        }
        if (!bVar1) goto LAB_00103345;
        if (expected[local_2c] != actual[local_2c]) break;
        local_2c = local_2c + 1;
      }
      Unity.CurrentTestFailed = 1;
    }
LAB_00103345:
    if (Unity.CurrentTestFailed != 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrintExpectedAndActualStrings(expected,actual);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualString(const char* expected,
                            const char* actual,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber)
{
    UNITY_UINT32 i;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if both pointers not null compare the strings */
    if (expected && actual)
    {
        for (i = 0; expected[i] || actual[i]; i++)
        {
            if (expected[i] != actual[i])
            {
                Unity.CurrentTestFailed = 1;
                break;
            }
        }
    }
    else
    { /* handle case of one pointers being null (if both null, test should pass) */
        if (expected != actual)
        {
            Unity.CurrentTestFailed = 1;
        }
    }

    if (Unity.CurrentTestFailed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrintExpectedAndActualStrings(expected, actual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}